

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

int __thiscall google::protobuf::io::CopyingInputStream::Skip(CopyingInputStream *this,int count)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  char junk [4096];
  undefined1 auStack_1038 [4104];
  
  iVar2 = 0;
  do {
    iVar5 = iVar2;
    uVar3 = count - iVar5;
    if (uVar3 == 0 || count < iVar5) {
      return iVar5;
    }
    uVar4 = (ulong)uVar3;
    if (0xfff < (int)uVar3) {
      uVar4 = 0x1000;
    }
    iVar1 = (*this->_vptr_CopyingInputStream[2])(this,auStack_1038,uVar4);
    iVar2 = 0;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    iVar2 = iVar2 + iVar5;
  } while (0 < iVar1);
  return iVar5;
}

Assistant:

int CopyingInputStream::Skip(int count) {
  char junk[4096];
  int skipped = 0;
  while (skipped < count) {
    int bytes = Read(junk, std::min(count - skipped,
                                    absl::implicit_cast<int>(sizeof(junk))));
    if (bytes <= 0) {
      // EOF or read error.
      return skipped;
    }
    skipped += bytes;
  }
  return skipped;
}